

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hawktracer.cpp
# Opt level: O1

void ht_timeline_destroy(HT_Timeline *timeline)

{
  HT_Feature *pHVar1;
  _HT_Mutex *__ptr;
  long lVar2;
  
  if (timeline == (HT_Timeline *)0x0) {
    __assert_fail("timeline",
                  "/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/build_O1/hawktracer.cpp"
                  ,0x7ca,"void ht_timeline_destroy(HT_Timeline *)");
  }
  ht_timeline_flush(timeline);
  if (realloc_fnc_ == (realloc_function)0x0) {
    free(timeline->buffer);
  }
  else {
    (*realloc_fnc_)(timeline->buffer,0,user_data_);
  }
  ht_timeline_listener_container_unref(timeline->listeners);
  lVar2 = 0;
  do {
    pHVar1 = timeline->features[lVar2];
    if (pHVar1 != (HT_Feature *)0x0) {
      (*pHVar1->klass->destroy)(pHVar1);
      timeline->features[lVar2] = (HT_Feature *)0x0;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x20);
  __ptr = timeline->locking_policy;
  if (__ptr != (_HT_Mutex *)0x0) {
    if (realloc_fnc_ == (realloc_function)0x0) {
      free(__ptr);
    }
    else {
      (*realloc_fnc_)(__ptr,0,user_data_);
    }
  }
  if (realloc_fnc_ != (realloc_function)0x0) {
    (*realloc_fnc_)(timeline,0,user_data_);
    return;
  }
  free(timeline);
  return;
}

Assistant:

void
ht_timeline_destroy(HT_Timeline* timeline)
{
    size_t i;

    assert(timeline);

    ht_timeline_flush(timeline);
    ht_free(timeline->buffer);

    ht_timeline_listener_container_unref(timeline->listeners);

    for (i = 0; i < sizeof(timeline->features) / sizeof(timeline->features[0]); i++)
    {
        if (timeline->features[i])
        {
            timeline->features[i]->klass->destroy(timeline->features[i]);
            timeline->features[i] = NULL;
        }
    }

    if (timeline->locking_policy)
    {
        ht_mutex_destroy(timeline->locking_policy);
    }

    ht_free(timeline);
}